

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlc.h
# Opt level: O0

word * Wlc_ObjTable(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  Vec_Ptr_t *p_00;
  int i;
  word *pwVar1;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  
  p_00 = p->vTables;
  i = Wlc_ObjTableId(pObj);
  pwVar1 = (word *)Vec_PtrEntry(p_00,i);
  return pwVar1;
}

Assistant:

static inline word *       Wlc_ObjTable( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )          { return (word *)Vec_PtrEntry( p->vTables, Wlc_ObjTableId(pObj) );         }